

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

RowGroup * __thiscall duckdb_parquet::RowGroup::operator=(RowGroup *this,RowGroup *other153)

{
  int64_t iVar1;
  
  std::vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>::operator=
            (&(this->columns).
              super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
             ,&(other153->columns).
               super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
            );
  iVar1 = other153->num_rows;
  this->total_byte_size = other153->total_byte_size;
  this->num_rows = iVar1;
  std::vector<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>::
  operator=(&(this->sorting_columns).
             super_vector<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>
            ,&(other153->sorting_columns).
              super_vector<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>
           );
  iVar1 = other153->total_compressed_size;
  this->file_offset = other153->file_offset;
  this->total_compressed_size = iVar1;
  this->ordinal = other153->ordinal;
  this->__isset = other153->__isset;
  return this;
}

Assistant:

RowGroup& RowGroup::operator=(const RowGroup& other153) {
  columns = other153.columns;
  total_byte_size = other153.total_byte_size;
  num_rows = other153.num_rows;
  sorting_columns = other153.sorting_columns;
  file_offset = other153.file_offset;
  total_compressed_size = other153.total_compressed_size;
  ordinal = other153.ordinal;
  __isset = other153.__isset;
  return *this;
}